

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-history.c
# Opt level: O3

void dump_history(ang_file *file)

{
  int iVar1;
  _Bool _Var2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  history_info *history_list_local;
  char buf [120];
  history_info *local_b0;
  char local_a8 [120];
  
  local_b0 = (history_info *)0x0;
  sVar3 = history_get_list(player,&local_b0);
  file_putf(file,"[Player history]\n");
  file_putf(file,"      Turn   Place               Note\n");
  if (sVar3 != 0) {
    lVar5 = 0;
    do {
      iVar1 = *(int *)(local_b0->event + lVar5 + -4);
      pcVar4 = level_name(world->levels + *(short *)(local_b0->type + lVar5 + 2));
      strnfmt(local_a8,0x78,"%10ld%20s\'  %s",(long)iVar1,pcVar4,local_b0->event + lVar5);
      _Var2 = flag_has_dbg(local_b0->type + lVar5,2,4,"history_list_local[i].type",
                           "HIST_ARTIFACT_LOST");
      if (_Var2) {
        my_strcat(local_a8," (LOST)",0x78);
      }
      file_putf(file,"%s",local_a8);
      file_put(file,"\n");
      lVar5 = lVar5 + 0x5c;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  return;
}

Assistant:

void dump_history(ang_file *file)
{
	struct history_info *history_list_local = NULL;
	size_t max_item = history_get_list(player, &history_list_local);
	size_t i;
	char buf[120];

	file_putf(file, "[Player history]\n");
	file_putf(file, "      Turn   Place               Note\n");

	for (i = 0; i < max_item; i++) {
		strnfmt(buf, sizeof(buf), "%10ld%20s\'  %s",
				(long)history_list_local[i].turn,
				level_name(&world->levels[history_list_local[i].place]),
				history_list_local[i].event);

		if (hist_has(history_list_local[i].type, HIST_ARTIFACT_LOST))
			my_strcat(buf, " (LOST)", sizeof(buf));

		file_putf(file, "%s", buf);
		file_put(file, "\n");
	}

	return;
}